

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::load_entries<setup::data_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::data_entry,_std::allocator<setup::data_entry>_> *result,enum_type entry_type
          )

{
  TypesafeBoolean p_Var1;
  ulong in_RCX;
  vector<setup::data_entry,_std::allocator<setup::data_entry>_> *in_R8;
  data_entry entry;
  size_t i_1;
  size_t i;
  info *in_stack_000003b0;
  istream *in_stack_000003b8;
  data_entry *in_stack_000003c0;
  enum_type in_stack_ffffffffffffff34;
  flags<setup::info::entry_types_Enum_,_21UL> *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff48;
  vector<setup::data_entry,_std::allocator<setup::data_entry>_> *in_stack_ffffffffffffff50;
  undefined8 local_48;
  undefined8 local_40;
  
  std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>::clear
            ((vector<setup::data_entry,_std::allocator<setup::data_entry>_> *)0x17b030);
  flags<setup::info::entry_types_Enum_,_21UL>::operator&
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  p_Var1 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x17b059);
  if (p_Var1 == (TypesafeBoolean)0x0) {
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      data_entry::data_entry((data_entry *)0x17b0fb);
      data_entry::load(in_stack_000003c0,in_stack_000003b8,in_stack_000003b0);
    }
  }
  else {
    std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>::resize
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>::operator[](in_R8,local_40)
      ;
      data_entry::load(in_stack_000003c0,in_stack_000003b8,in_stack_000003b0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}